

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

Integer pnga_read_inc(Integer g_a,Integer *subscript,Integer inc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Integer IVar6;
  long lVar7;
  long in_RSI;
  long in_RDI;
  Integer _index2_1 [7];
  int _i_13;
  int _ndim_13;
  int _ndim_12;
  int _i_12;
  int _itmp_5;
  Integer index_1 [7];
  Integer j_2;
  Integer _index2 [7];
  int _i_11;
  int _ndim_11;
  int _ndim_10;
  int _i_10;
  int _itmp_4;
  Integer index [7];
  Integer j_1;
  Integer offset;
  Integer last;
  Integer jtot;
  Integer j;
  Integer hi [7];
  Integer lo [7];
  char err_string_3 [256];
  Integer _d_7;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _p_handle_1;
  Integer _pinv_1;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _last_1;
  Integer _factor_1;
  Integer _w_1;
  Integer _d_4;
  Integer _offset_2;
  char err_string_2 [256];
  Integer _d_3;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _p_handle;
  Integer _pinv;
  Integer _hi [7];
  Integer _lo [7];
  Integer _last;
  Integer _factor;
  Integer _w;
  Integer _d;
  Integer _offset;
  char err_string_1 [256];
  char err_string [256];
  void *pval;
  long lvalue;
  int ivalue;
  int optype;
  Integer ndim;
  Integer p_handle;
  Integer handle;
  Integer proc;
  Integer ldp [7];
  char *ptr;
  int in_stack_fffffffffffff648;
  int in_stack_fffffffffffff64c;
  void *in_stack_fffffffffffff650;
  void *in_stack_fffffffffffff658;
  int in_stack_fffffffffffff664;
  int local_96c;
  int local_960;
  int local_95c;
  long local_958 [7];
  long local_920;
  long alStack_918 [7];
  int local_8dc;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  long local_8c8 [7];
  long local_890;
  long local_888;
  long local_880;
  long local_878;
  long local_870;
  long local_828 [2];
  Integer in_stack_fffffffffffff7e8;
  char *in_stack_fffffffffffff7f0;
  char local_7e8 [256];
  Integer *in_stack_fffffffffffff918;
  ulong uVar8;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  int iVar9;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  int local_6c8 [7];
  int local_6ac;
  undefined4 in_stack_fffffffffffff958;
  int iVar10;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  Integer in_stack_fffffffffffff970;
  Integer *in_stack_fffffffffffff978;
  Integer *in_stack_fffffffffffff980;
  Integer in_stack_fffffffffffff988;
  int local_66c;
  long local_660;
  long local_650;
  long local_648;
  long local_640;
  long local_628;
  long local_618;
  long local_610;
  long local_608;
  long local_5f0;
  long local_5e8 [8];
  long local_5a8 [7];
  long local_570;
  long local_568;
  long local_560;
  long local_558;
  long local_550;
  char local_548 [256];
  ulong local_448;
  int local_440;
  int local_43c;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  int local_428 [7];
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8 [10];
  int local_3d0;
  int local_3cc;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  void *local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  void *local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  void *local_350;
  long local_348 [8];
  long local_308 [7];
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  char local_2a8 [256];
  char local_1a8 [264];
  long *local_a0;
  long local_98;
  int local_90 [2];
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  long local_68 [8];
  char *local_28;
  long local_18;
  long local_10;
  long local_8;
  
  local_78 = in_RDI + 1000;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_1a8,"%s: INVALID ARRAY HANDLE","nga_read_inc");
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  if (GA[local_10 + 1000].actv == 0) {
    sprintf(local_2a8,"%s: ARRAY NOT ACTIVE","nga_read_inc");
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  if (((GA[local_78].type != 0x3e9) && (GA[local_78].type != 0x3ea)) && (GA[local_78].type != 0x3f8)
     ) {
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  GAstat.numrdi = GAstat.numrdi + 1;
  GAbytes.rditot = GAbytes.rditot + 8.0;
  local_80 = (long)GA[local_78].p_handle;
  local_88 = (long)GA[local_78].ndim;
  pnga_locate(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  if (GA[local_78].distr_type == 0) {
    if (GA[local_78].num_rstrctd == 0) {
      local_2b0 = 0;
      local_2c8 = 1;
      local_2d0 = (long)(GA[local_78].ndim + -1);
      if (GA[local_78].distr_type == 0) {
        if (GA[local_78].num_rstrctd == 0) {
          local_380 = (long)GA[local_78].ndim;
          local_388 = 0;
          local_368 = 1;
          for (local_370 = 0; local_370 < local_380; local_370 = local_370 + 1) {
            local_368 = GA[local_78].nblock[local_370] * local_368;
          }
          if ((local_368 + -1 < (long)local_70) || ((long)local_70 < 0)) {
            for (local_370 = 0; local_370 < local_380; local_370 = local_370 + 1) {
              local_308[local_370] = 0;
              local_348[local_370] = -1;
            }
          }
          else {
            local_378 = local_70;
            for (local_370 = 0; local_370 < local_380; local_370 = local_370 + 1) {
              local_360 = (long)local_378 % (long)GA[local_78].nblock[local_370];
              local_378 = (void *)((long)local_378 / (long)GA[local_78].nblock[local_370]);
              local_390 = local_360 + local_388;
              local_388 = GA[local_78].nblock[local_370] + local_388;
              local_308[local_370] = GA[local_78].mapc[local_390];
              if (local_360 == GA[local_78].nblock[local_370] + -1) {
                local_348[local_370] = GA[local_78].dims[local_370];
              }
              else {
                local_348[local_370] = GA[local_78].mapc[local_390 + 1] + -1;
              }
            }
          }
        }
        else if ((long)local_70 < GA[local_78].num_rstrctd) {
          local_3b8 = (long)GA[local_78].ndim;
          local_3c0 = 0;
          local_3a0 = 1;
          for (local_3a8 = 0; local_3a8 < local_3b8; local_3a8 = local_3a8 + 1) {
            local_3a0 = GA[local_78].nblock[local_3a8] * local_3a0;
          }
          if ((local_3a0 + -1 < (long)local_70) || ((long)local_70 < 0)) {
            for (local_3a8 = 0; local_3a8 < local_3b8; local_3a8 = local_3a8 + 1) {
              local_308[local_3a8] = 0;
              local_348[local_3a8] = -1;
            }
          }
          else {
            local_3b0 = local_70;
            for (local_3a8 = 0; local_3a8 < local_3b8; local_3a8 = local_3a8 + 1) {
              local_398 = (long)local_3b0 % (long)GA[local_78].nblock[local_3a8];
              local_3b0 = (void *)((long)local_3b0 / (long)GA[local_78].nblock[local_3a8]);
              local_3c8 = local_398 + local_3c0;
              local_3c0 = GA[local_78].nblock[local_3a8] + local_3c0;
              local_308[local_3a8] = GA[local_78].mapc[local_3c8];
              if (local_398 == GA[local_78].nblock[local_3a8] + -1) {
                local_348[local_3a8] = GA[local_78].dims[local_3a8];
              }
              else {
                local_348[local_3a8] = GA[local_78].mapc[local_3c8 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar2 = GA[local_78].ndim;
          local_3d0 = (int)sVar2;
          for (local_3cc = 0; local_3cc < sVar2; local_3cc = local_3cc + 1) {
            local_308[local_3cc] = 0;
            local_348[local_3cc] = -1;
          }
        }
      }
      else {
        iVar3 = (int)local_70;
        if (((GA[local_78].distr_type == 1) || (GA[local_78].distr_type == 2)) ||
           (GA[local_78].distr_type == 3)) {
          sVar2 = GA[local_78].ndim;
          local_400 = (int)sVar2;
          sVar1 = GA[local_78].ndim;
          local_40c = (int)sVar1;
          local_404 = iVar3;
          local_3f8[0] = (int)((long)iVar3 % GA[local_78].num_blocks[0]);
          for (local_408 = 1; local_408 < sVar1; local_408 = local_408 + 1) {
            local_404 = (int)((long)(local_404 - local_3f8[local_408 + -1]) /
                             GA[local_78].num_blocks[local_408 + -1]);
            local_3f8[local_408] = (int)((long)local_404 % GA[local_78].num_blocks[local_408]);
          }
          for (local_3fc = 0; local_3fc < sVar2; local_3fc = local_3fc + 1) {
            local_308[local_3fc] =
                 (long)local_3f8[local_3fc] * GA[local_78].block_dims[local_3fc] + 1;
            local_348[local_3fc] =
                 (long)(local_3f8[local_3fc] + 1) * GA[local_78].block_dims[local_3fc];
            if (GA[local_78].dims[local_3fc] < local_348[local_3fc]) {
              local_348[local_3fc] = GA[local_78].dims[local_3fc];
            }
          }
        }
        else if (GA[local_78].distr_type == 4) {
          sVar2 = GA[local_78].ndim;
          local_430 = (int)sVar2;
          local_434 = 0;
          sVar1 = GA[local_78].ndim;
          local_440 = (int)sVar1;
          local_438 = iVar3;
          local_428[0] = (int)((long)iVar3 % GA[local_78].num_blocks[0]);
          for (local_43c = 1; local_43c < sVar1; local_43c = local_43c + 1) {
            local_438 = (int)((long)(local_438 - local_428[local_43c + -1]) /
                             GA[local_78].num_blocks[local_43c + -1]);
            local_428[local_43c] = (int)((long)local_438 % GA[local_78].num_blocks[local_43c]);
          }
          for (local_42c = 0; local_42c < sVar2; local_42c = local_42c + 1) {
            local_308[local_42c] = GA[local_78].mapc[local_434 + local_428[local_42c]];
            if ((long)local_428[local_42c] < GA[local_78].num_blocks[local_42c] + -1) {
              local_348[local_42c] = GA[local_78].mapc[local_434 + local_428[local_42c] + 1] + -1;
            }
            else {
              local_348[local_42c] = GA[local_78].dims[local_42c];
            }
            local_434 = local_434 + (int)GA[local_78].num_blocks[local_42c];
          }
        }
      }
      for (local_448 = 0; (long)local_448 < (long)GA[local_78].ndim; local_448 = local_448 + 1) {
        if ((*(long *)(local_18 + local_448 * 8) < local_308[local_448]) ||
           (local_348[local_448] < *(long *)(local_18 + local_448 * 8))) {
          sprintf(local_548,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                  *(undefined8 *)(local_18 + local_448 * 8),local_308[local_448],
                  local_348[local_448],local_448 & 0xffffffff);
          pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        }
      }
      if (local_2d0 == 0) {
        local_68[0] = (local_348[0] - local_308[0]) + 1 + GA[local_78].width[0] * 2;
      }
      for (local_2b8 = 0; local_2b8 < local_2d0; local_2b8 = local_2b8 + 1) {
        local_2c0 = GA[local_78].width[local_2b8];
        local_2b0 = ((*(long *)(local_18 + local_2b8 * 8) - local_308[local_2b8]) + local_2c0) *
                    local_2c8 + local_2b0;
        local_68[local_2b8] = (local_348[local_2b8] - local_308[local_2b8]) + 1 + local_2c0 * 2;
        local_2c8 = local_68[local_2b8] * local_2c8;
      }
      local_2b0 = ((*(long *)(local_18 + local_2d0 * 8) - local_308[local_2d0]) +
                  GA[local_78].width[local_2d0]) * local_2c8 + local_2b0;
      local_358 = (long)GA[local_78].p_handle;
      if ((long)GA[local_78].p_handle == 0) {
        local_350 = (void *)(long)PGRP_LIST->inv_map_proc_list[(long)local_70];
      }
      else if (GA[local_78].num_rstrctd == 0) {
        local_350 = local_70;
      }
      else {
        local_350 = (void *)GA[local_78].rstrctd_list[(long)local_70];
      }
      local_28 = GA[local_78].ptr[(long)local_350] + local_2b0 * GA[local_78].elemsize;
    }
    else {
      local_550 = 0;
      local_568 = 1;
      local_570 = (long)(GA[local_78].ndim + -1);
      if (GA[local_78].distr_type == 0) {
        if (GA[local_78].num_rstrctd == 0) {
          lVar4 = (long)GA[local_78].ndim;
          local_628 = 0;
          local_608 = 1;
          for (local_610 = 0; local_610 < lVar4; local_610 = local_610 + 1) {
            local_608 = GA[local_78].nblock[local_610] * local_608;
          }
          if ((local_608 + -1 < GA[local_78].rank_rstrctd[(long)local_70]) ||
             (GA[local_78].rank_rstrctd[(long)local_70] < 0)) {
            for (local_610 = 0; local_610 < lVar4; local_610 = local_610 + 1) {
              local_5a8[local_610] = 0;
              local_5e8[local_610] = -1;
            }
          }
          else {
            local_618 = GA[local_78].rank_rstrctd[(long)local_70];
            for (local_610 = 0; local_610 < lVar4; local_610 = local_610 + 1) {
              lVar7 = local_618 % (long)GA[local_78].nblock[local_610];
              local_618 = local_618 / (long)GA[local_78].nblock[local_610];
              lVar5 = lVar7 + local_628;
              local_628 = GA[local_78].nblock[local_610] + local_628;
              local_5a8[local_610] = GA[local_78].mapc[lVar5];
              if (lVar7 == GA[local_78].nblock[local_610] + -1) {
                local_5e8[local_610] = GA[local_78].dims[local_610];
              }
              else {
                local_5e8[local_610] = GA[local_78].mapc[lVar5 + 1] + -1;
              }
            }
          }
        }
        else if (GA[local_78].rank_rstrctd[(long)local_70] < GA[local_78].num_rstrctd) {
          lVar4 = (long)GA[local_78].ndim;
          local_660 = 0;
          local_640 = 1;
          for (local_648 = 0; local_648 < lVar4; local_648 = local_648 + 1) {
            local_640 = GA[local_78].nblock[local_648] * local_640;
          }
          if ((local_640 + -1 < GA[local_78].rank_rstrctd[(long)local_70]) ||
             (GA[local_78].rank_rstrctd[(long)local_70] < 0)) {
            for (local_648 = 0; local_648 < lVar4; local_648 = local_648 + 1) {
              local_5a8[local_648] = 0;
              local_5e8[local_648] = -1;
            }
          }
          else {
            local_650 = GA[local_78].rank_rstrctd[(long)local_70];
            for (local_648 = 0; local_648 < lVar4; local_648 = local_648 + 1) {
              lVar7 = local_650 % (long)GA[local_78].nblock[local_648];
              local_650 = local_650 / (long)GA[local_78].nblock[local_648];
              lVar5 = lVar7 + local_660;
              local_660 = GA[local_78].nblock[local_648] + local_660;
              local_5a8[local_648] = GA[local_78].mapc[lVar5];
              if (lVar7 == GA[local_78].nblock[local_648] + -1) {
                local_5e8[local_648] = GA[local_78].dims[local_648];
              }
              else {
                local_5e8[local_648] = GA[local_78].mapc[lVar5 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar2 = GA[local_78].ndim;
          for (local_66c = 0; local_66c < sVar2; local_66c = local_66c + 1) {
            local_5a8[local_66c] = 0;
            local_5e8[local_66c] = -1;
          }
        }
      }
      else if (((GA[local_78].distr_type == 1) || (GA[local_78].distr_type == 2)) ||
              (GA[local_78].distr_type == 3)) {
        sVar2 = GA[local_78].ndim;
        sVar1 = GA[local_78].ndim;
        local_6ac = (int)sVar1;
        iVar3 = (int)GA[local_78].rank_rstrctd[(long)local_70];
        for (iVar10 = 1; iVar10 < sVar1; iVar10 = iVar10 + 1) {
          iVar3 = (int)((long)(iVar3 - *(int *)(&stack0xfffffffffffff968 + (long)(iVar10 + -1) * 4))
                       / GA[local_78].num_blocks[iVar10 + -1]);
          *(int *)(&stack0xfffffffffffff968 + (long)iVar10 * 4) =
               (int)((long)iVar3 % GA[local_78].num_blocks[iVar10]);
        }
        for (iVar3 = 0; iVar3 < sVar2; iVar3 = iVar3 + 1) {
          local_5a8[iVar3] =
               (long)*(int *)(&stack0xfffffffffffff968 + (long)iVar3 * 4) *
               GA[local_78].block_dims[iVar3] + 1;
          local_5e8[iVar3] =
               (long)(*(int *)(&stack0xfffffffffffff968 + (long)iVar3 * 4) + 1) *
               GA[local_78].block_dims[iVar3];
          if (GA[local_78].dims[iVar3] < local_5e8[iVar3]) {
            local_5e8[iVar3] = GA[local_78].dims[iVar3];
          }
        }
      }
      else if (GA[local_78].distr_type == 4) {
        sVar2 = GA[local_78].ndim;
        iVar9 = 0;
        sVar1 = GA[local_78].ndim;
        iVar3 = (int)GA[local_78].rank_rstrctd[(long)local_70];
        local_6c8[0] = (int)((long)iVar3 % GA[local_78].num_blocks[0]);
        for (iVar10 = 1; iVar10 < sVar1; iVar10 = iVar10 + 1) {
          iVar3 = (int)((long)(iVar3 - local_6c8[iVar10 + -1]) /
                       GA[local_78].num_blocks[iVar10 + -1]);
          local_6c8[iVar10] = (int)((long)iVar3 % GA[local_78].num_blocks[iVar10]);
        }
        for (iVar3 = 0; iVar3 < sVar2; iVar3 = iVar3 + 1) {
          local_5a8[iVar3] = GA[local_78].mapc[iVar9 + local_6c8[iVar3]];
          if ((long)local_6c8[iVar3] < GA[local_78].num_blocks[iVar3] + -1) {
            local_5e8[iVar3] = GA[local_78].mapc[iVar9 + local_6c8[iVar3] + 1] + -1;
          }
          else {
            local_5e8[iVar3] = GA[local_78].dims[iVar3];
          }
          iVar9 = iVar9 + (int)GA[local_78].num_blocks[iVar3];
        }
      }
      for (uVar8 = 0; (long)uVar8 < (long)GA[local_78].ndim; uVar8 = uVar8 + 1) {
        if ((*(long *)(local_18 + uVar8 * 8) < local_5a8[uVar8]) ||
           (local_5e8[uVar8] < *(long *)(local_18 + uVar8 * 8))) {
          sprintf(local_7e8,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                  *(undefined8 *)(local_18 + uVar8 * 8),local_5a8[uVar8],local_5e8[uVar8],
                  uVar8 & 0xffffffff);
          pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        }
      }
      if (local_570 == 0) {
        local_68[0] = (local_5e8[0] - local_5a8[0]) + 1 + GA[local_78].width[0] * 2;
      }
      for (local_558 = 0; local_558 < local_570; local_558 = local_558 + 1) {
        local_560 = GA[local_78].width[local_558];
        local_550 = ((*(long *)(local_18 + local_558 * 8) - local_5a8[local_558]) + local_560) *
                    local_568 + local_550;
        local_68[local_558] = (local_5e8[local_558] - local_5a8[local_558]) + 1 + local_560 * 2;
        local_568 = local_68[local_558] * local_568;
      }
      local_550 = ((*(long *)(local_18 + local_570 * 8) - local_5a8[local_570]) +
                  GA[local_78].width[local_570]) * local_568 + local_550;
      if (GA[local_78].p_handle == 0) {
        local_5f0 = (long)PGRP_LIST->inv_map_proc_list[GA[local_78].rank_rstrctd[(long)local_70]];
      }
      else if (GA[local_78].num_rstrctd == 0) {
        local_5f0 = GA[local_78].rank_rstrctd[(long)local_70];
      }
      else {
        local_5f0 = GA[local_78].rstrctd_list[GA[local_78].rank_rstrctd[(long)local_70]];
      }
      local_28 = GA[local_78].ptr[local_5f0] + local_550 * GA[local_78].elemsize;
    }
  }
  else {
    pnga_distribution(in_stack_fffffffffffff970,
                      CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                      (Integer *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                      (Integer *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    pnga_access_block_ptr
              (CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (void *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918);
    pnga_release_block(local_10,(Integer)local_70);
    local_888 = 0;
    local_880 = local_88 + -1;
    local_878 = 1;
    for (local_870 = 0; local_870 < local_880; local_870 = local_870 + 1) {
      local_888 = (*(long *)(local_18 + local_870 * 8) - local_828[local_870]) * local_878 +
                  local_888;
      local_878 = local_68[local_870] * local_878;
    }
    local_888 = (*(long *)(local_18 + local_880 * 8) - local_828[local_880]) * local_878 + local_888
    ;
    local_28 = (char *)(local_888 * GA[local_78].elemsize + (long)local_28);
  }
  if (GA[local_78].type == 0x3e9) {
    local_90[1] = 0xc;
    local_a0 = (long *)local_90;
  }
  else {
    local_90[1] = 0xd;
    local_a0 = &local_98;
  }
  if ((void *)GAme == local_70) {
    GAbytes.rdiloc = GAbytes.rdiloc + 8.0;
  }
  if (GA[local_78].distr_type == 1) {
    IVar6 = pnga_nnodes();
    in_stack_fffffffffffff650 = local_70;
    local_70 = (void *)((long)local_70 % IVar6);
  }
  else {
    local_95c = (int)local_70;
    if (GA[local_78].distr_type == 2) {
      sVar2 = GA[local_78].ndim;
      local_8d4 = (int)sVar2;
      local_8cc = local_95c;
      local_8c8[0] = (long)local_95c % GA[local_78].num_blocks[0];
      for (local_8d0 = 1; local_8d0 < sVar2; local_8d0 = local_8d0 + 1) {
        local_8cc = (int)(((long)local_8cc - local_8c8[local_8d0 + -1]) /
                         GA[local_78].num_blocks[local_8d0 + -1]);
        local_8c8[local_8d0] = (long)local_8cc % GA[local_78].num_blocks[local_8d0];
      }
      for (local_890 = 0; local_890 < local_88; local_890 = local_890 + 1) {
        local_8c8[local_890] = local_8c8[local_890] % (long)GA[local_78].nblock[local_890];
      }
      local_8d8 = (int)GA[local_78].ndim;
      for (local_8dc = 0; local_8dc < local_8d8; local_8dc = local_8dc + 1) {
        alStack_918[local_8dc] = local_8c8[local_8dc] % (long)GA[local_78].nblock[local_8dc];
      }
      local_70 = (void *)alStack_918[local_8d8 + -1];
      for (local_8dc = local_8d8 + -2; -1 < local_8dc; local_8dc = local_8dc + -1) {
        local_70 = (void *)((long)local_70 * (long)GA[local_78].nblock[local_8dc] +
                           alStack_918[local_8dc]);
      }
    }
    else if ((GA[local_78].distr_type == 3) || (GA[local_78].distr_type == 4)) {
      sVar2 = GA[local_78].ndim;
      local_958[0] = (long)local_95c % GA[local_78].num_blocks[0];
      for (local_960 = 1; local_960 < sVar2; local_960 = local_960 + 1) {
        local_95c = (int)(((long)local_95c - local_958[local_960 + -1]) /
                         GA[local_78].num_blocks[local_960 + -1]);
        local_958[local_960] = (long)local_95c % GA[local_78].num_blocks[local_960];
      }
      for (local_920 = 0; local_920 < local_88; local_920 = local_920 + 1) {
        local_958[local_920] = local_958[local_920] % (long)GA[local_78].nblock[local_920];
      }
      iVar3 = (int)GA[local_78].ndim;
      for (local_96c = 0; local_96c < iVar3; local_96c = local_96c + 1) {
        *(long *)(&stack0xfffffffffffff658 + (long)local_96c * 8) =
             local_958[local_96c] % (long)GA[local_78].nblock[local_96c];
      }
      local_70 = *(void **)(&stack0xfffffffffffff658 + (long)(iVar3 + -1) * 8);
      for (local_96c = iVar3 + -2; -1 < local_96c; local_96c = local_96c + -1) {
        local_70 = (void *)((long)local_70 * (long)GA[local_78].nblock[local_96c] +
                           *(long *)(&stack0xfffffffffffff658 + (long)local_96c * 8));
      }
    }
  }
  if (local_80 != -1) {
    local_70 = (void *)(long)PGRP_LIST[local_80].inv_map_proc_list[(long)local_70];
  }
  ARMCI_Rmw(in_stack_fffffffffffff664,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
            in_stack_fffffffffffff64c,in_stack_fffffffffffff648);
  if (GA[local_78].type == 0x3e9) {
    local_8 = (long)local_90[0];
  }
  else {
    local_8 = local_98;
  }
  return local_8;
}

Assistant:

Integer pnga_read_inc(Integer g_a, Integer* subscript, Integer inc)
{
GA_Internal_Threadsafe_Lock();
char *ptr;
Integer ldp[MAXDIM], proc, handle=GA_OFFSET+g_a, p_handle, ndim;
int optype,ivalue;
long lvalue;
void *pval;

    ga_check_handleM(g_a, "nga_read_inc");
    
    /* BJP printf("p[%d] g_a: %d subscript: %d inc: %d\n",GAme, g_a, subscript[0], inc); */

    if(GA[handle].type!=C_INT && GA[handle].type!=C_LONG &&
       GA[handle].type!=C_LONGLONG)
       pnga_error("type must be integer",GA[handle].type);

    GAstat.numrdi++;
    GAbytes.rditot += (double)sizeof(Integer);
    p_handle = GA[handle].p_handle;
    ndim = GA[handle].ndim;

    /* find out who owns it */
    pnga_locate(g_a, subscript, &proc);

    /* get an address of the g_a(subscript) element */
    if (GA[handle].distr_type == REGULAR) {
      if (GA[handle].num_rstrctd == 0) {
        gam_Location(proc, handle,  subscript, (char**)&ptr, ldp);
      } else {
        gam_Location(GA[handle].rank_rstrctd[proc], handle,  subscript, (char**)&ptr, ldp);
      }
    } else {
      Integer lo[MAXDIM], hi[MAXDIM];
      Integer j, jtot, last, offset;
      pnga_distribution(g_a, proc, lo, hi);
      pnga_access_block_ptr(g_a, proc, (char**)&ptr, ldp);
      pnga_release_block(g_a, proc);
      offset = 0;
      last = ndim - 1;
      jtot = 1;
      for (j=0; j<last; j++) {
        offset += (subscript[j]-lo[j])*jtot;
        jtot *= ldp[j];
      }
      offset += (subscript[last]-lo[last])*jtot;
      ptr += offset*GA[handle].elemsize;
    }

    if(GA[handle].type==C_INT){
       optype = ARMCI_FETCH_AND_ADD;
       pval = &ivalue;
    }else{
       optype = ARMCI_FETCH_AND_ADD_LONG;
       pval = &lvalue;
    }

    if(GAme == proc)GAbytes.rdiloc += (double)sizeof(Integer);

    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_tile_proc_from_indices(handle,proc,index);
    }
    if (p_handle != -1) {   
       proc=PGRP_LIST[p_handle].inv_map_proc_list[proc];
       /*printf("\n%d:proc=%d",GAme,proc);fflush(stdout);*/
    }

    ARMCI_Rmw(optype, pval, (int*)ptr, (int)inc, (int)proc);


   GA_Internal_Threadsafe_Unlock();
   if(GA[handle].type==C_INT)
       return (Integer) ivalue;
   else
       return (Integer) lvalue;
}